

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddInteract.c
# Opt level: O1

int cuddInitInteract(DdManager *table)

{
  size_t __size;
  int iVar1;
  int iVar2;
  DdNode **ppDVar3;
  DdSubtable *pDVar4;
  long *__s;
  int *support;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  DdNode *sentinel;
  int *piVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  DdManager *pDVar13;
  DdManager *pDVar14;
  long lVar15;
  uint uVar16;
  
  iVar1 = table->size;
  uVar16 = ((iVar1 + -1) * iVar1 >> 7) + 1;
  __s = (long *)malloc((ulong)uVar16 * 8);
  table->interact = __s;
  if (__s == (long *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    if (uVar16 != 0) {
      memset(__s,0,(ulong)uVar16 << 3);
    }
    __size = (long)iVar1 * 4;
    support = (int *)malloc(__size);
    if (support != (int *)0x0) {
      if (0 < iVar1) {
        lVar7 = 0;
        do {
          lVar8 = (long)(int)table->subtables[lVar7].slots;
          if (0 < lVar8) {
            ppDVar3 = table->subtables[lVar7].nodelist;
            lVar15 = 0;
            do {
              for (pDVar14 = (DdManager *)ppDVar3[lVar15]; pDVar14 != table;
                  pDVar14 = (DdManager *)((ulong)(pDVar14->sentinel).next & 0xfffffffffffffffe)) {
                if (((ulong)(pDVar14->sentinel).next & 1) == 0) {
                  memset(support,0,__size);
                  ddSuppInteract(&pDVar14->sentinel,support);
                  ddClearLocal(&pDVar14->sentinel);
                  iVar2 = table->size;
                  lVar5 = (long)iVar2;
                  if (1 < lVar5) {
                    uVar11 = 0;
                    piVar9 = support;
                    do {
                      piVar9 = piVar9 + 1;
                      lVar5 = lVar5 + -1;
                      if (support[uVar11] == 1) {
                        iVar10 = (int)uVar11;
                        lVar12 = 0;
                        do {
                          if (piVar9[lVar12] == 1) {
                            iVar6 = (((iVar2 * 2 + -3) - iVar10) * iVar10 >> 1) + iVar10 +
                                    (int)lVar12;
                            table->interact[iVar6 >> 6] =
                                 table->interact[iVar6 >> 6] | 1L << ((byte)iVar6 & 0x3f);
                          }
                          lVar12 = lVar12 + 1;
                        } while (lVar5 != lVar12);
                      }
                      uVar11 = uVar11 + 1;
                    } while (uVar11 != iVar2 - 1);
                  }
                }
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 != lVar8);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar1);
      }
      iVar1 = table->size;
      if (0 < (long)iVar1) {
        pDVar4 = table->subtables;
        lVar7 = 0;
        do {
          lVar8 = (long)(int)pDVar4[lVar7].slots;
          if (0 < lVar8) {
            ppDVar3 = pDVar4[lVar7].nodelist;
            lVar15 = 0;
            do {
              pDVar14 = (DdManager *)ppDVar3[lVar15];
              while (pDVar14 != table) {
                pDVar13 = (DdManager *)((ulong)(pDVar14->sentinel).next & 0xfffffffffffffffe);
                (pDVar14->sentinel).next = (DdNode *)pDVar13;
                pDVar14 = pDVar13;
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 != lVar8);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar1);
      }
      free(support);
      return 1;
    }
    table->errorCode = CUDD_MEMORY_OUT;
    free(__s);
  }
  return 0;
}

Assistant:

int
cuddInitInteract(
  DdManager * table)
{
    int i,j,k;
    ABC_UINT64_T words;
    long *interact;
    int *support;
    DdNode *f;
    DdNode *sentinel = &(table->sentinel);
    DdNodePtr *nodelist;
    int slots;
    int n = table->size;

    words = ((n * (n-1)) >> (1 + LOGBPL)) + 1;
    table->interact = interact = ABC_ALLOC(long,(unsigned)words);
    if (interact == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (i = 0; i < words; i++) {
        interact[i] = 0;
    }

    support = ABC_ALLOC(int,n);
    if (support == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(interact);
        return(0);
    }

    for (i = 0; i < n; i++) {
        nodelist = table->subtables[i].nodelist;
        slots = table->subtables[i].slots;
        for (j = 0; j < slots; j++) {
            f = nodelist[j];
            while (f != sentinel) {
                /* A node is a root of the DAG if it cannot be
                ** reached by nodes above it. If a node was never
                ** reached during the previous depth-first searches,
                ** then it is a root, and we start a new depth-first
                ** search from it.
                */
                if (!Cudd_IsComplement(f->next)) {
                    for (k = 0; k < n; k++) {
                        support[k] = 0;
                    }
                    ddSuppInteract(f,support);
                    ddClearLocal(f);
                    ddUpdateInteract(table,support);
                }
                f = Cudd_Regular(f->next);
            }
        }
    }
    ddClearGlobal(table);

    ABC_FREE(support);
    return(1);

}